

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O2

REF_STATUS ref_layer_interior_seg_normal(REF_GRID ref_grid,REF_INT cell,REF_DBL *normal)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  REF_INT ntri;
  REF_INT tri_list [2];
  REF_DBL tri_side [3];
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar3 = ref_cell_nodes(ref_grid->cell[0],cell,nodes);
  if (uVar3 == 0) {
    uVar3 = ref_node_seg_normal(ref_node,nodes,normal);
    if (uVar3 == 0) {
      uVar3 = ref_math_normalize(normal);
      if (uVar3 == 0) {
        uVar3 = ref_cell_list_with2(ref_cell,nodes[0],nodes[1],2,&ntri,tri_list);
        if (uVar3 == 0) {
          if ((long)ntri != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x1f2,"ref_layer_interior_seg_normal","expected one tri at bounary",1,(long)ntri
                  );
            return 1;
          }
          pRVar1 = ref_cell->c2n;
          lVar5 = (long)ref_cell->size_per * (long)tri_list[0];
          lVar7 = (long)nodes[0];
          pRVar2 = ref_node->real;
          lVar5 = (long)(((pRVar1[lVar5 + 1] + pRVar1[lVar5] + pRVar1[lVar5 + 2]) -
                         (nodes[1] + nodes[0])) * 0xf);
          tri_side[0] = pRVar2[lVar5] - pRVar2[lVar7 * 0xf];
          tri_side[1] = pRVar2[lVar5 + 1] - pRVar2[lVar7 * 0xf + 1];
          tri_side[2] = pRVar2[lVar5 + 2] - pRVar2[lVar7 * 0xf + 2];
          uVar3 = ref_math_normalize(tri_side);
          if (uVar3 == 0) {
            if (0.0 <= tri_side[2] * normal[2] + tri_side[0] * *normal + normal[1] * tri_side[1]) {
              return 0;
            }
            *normal = -*normal;
            normal[1] = -normal[1];
            normal[2] = -normal[2];
            return 0;
          }
          uVar6 = (ulong)uVar3;
          pcVar8 = "norm";
          uVar4 = 0x1fc;
        }
        else {
          uVar6 = (ulong)uVar3;
          pcVar8 = "tri with2";
          uVar4 = 0x1f1;
        }
      }
      else {
        uVar6 = (ulong)uVar3;
        pcVar8 = "norm";
        uVar4 = 0x1ef;
      }
    }
    else {
      uVar6 = (ulong)uVar3;
      pcVar8 = "normal";
      uVar4 = 0x1ee;
    }
  }
  else {
    uVar6 = (ulong)uVar3;
    pcVar8 = "cell";
    uVar4 = 0x1ed;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar4,
         "ref_layer_interior_seg_normal",uVar6,pcVar8);
  return (REF_STATUS)uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_layer_interior_seg_normal(REF_GRID ref_grid,
                                                 REF_INT cell,
                                                 REF_DBL *normal) {
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ntri, tri_list[2], other, t;
  REF_DBL tri_side[3];
  REF_DBL dot;
  RSS(ref_cell_nodes(edg, cell, nodes), "cell");
  RSS(ref_node_seg_normal(ref_node, nodes, normal), "normal");
  RSS(ref_math_normalize(normal), "norm");
  RSS(ref_cell_list_with2(tri, nodes[0], nodes[1], 2, &ntri, tri_list),
      "tri with2");
  REIS(1, ntri, "expected one tri at bounary");
  t = tri_list[0];
  other = ref_cell_c2n(tri, 0, t) + ref_cell_c2n(tri, 1, t) +
          ref_cell_c2n(tri, 2, t) - nodes[0] - nodes[1];
  tri_side[0] =
      ref_node_xyz(ref_node, 0, other) - ref_node_xyz(ref_node, 0, nodes[0]);
  tri_side[1] =
      ref_node_xyz(ref_node, 1, other) - ref_node_xyz(ref_node, 1, nodes[0]);
  tri_side[2] =
      ref_node_xyz(ref_node, 2, other) - ref_node_xyz(ref_node, 2, nodes[0]);
  RSS(ref_math_normalize(tri_side), "norm");
  dot = ref_math_dot(normal, tri_side);
  if (dot < 0) {
    normal[0] = -normal[0];
    normal[1] = -normal[1];
    normal[2] = -normal[2];
  }
  return REF_SUCCESS;
}